

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

void Saig_BmcInterval(Saig_Bmc_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  int iVar4;
  int i;
  Aig_Obj_t *pAVar5;
  int iVar6;
  
  iVar1 = p->pFrm->vObjs->nSize;
  iVar2 = p->pFrm->nDeleted;
  p->vTargets->nSize = 0;
  iVar6 = p->iFrameLast;
  p->iFramePrev = iVar6;
  do {
    if (p->nFramesMax <= iVar6) {
      return;
    }
    iVar4 = p->iOutputLast;
    if (iVar4 == 0) {
      Saig_BmcObjSetFrame(p,p->pAig->pConst1,iVar6,p->pFrm->pConst1);
      iVar4 = p->iOutputLast;
    }
    while (pAVar3 = p->pAig, iVar4 < pAVar3->nTruePos) {
      if (p->nNodesMax + (iVar1 - iVar2) <= p->pFrm->vObjs->nSize - p->pFrm->nDeleted) {
        return;
      }
      p->vVisited->nSize = 0;
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAVar3->vCos,iVar4);
      pAVar5 = Saig_BmcIntervalConstruct_rec(p,pAVar5,p->iFrameLast,p->vVisited);
      Vec_PtrPush(p->vTargets,pAVar5);
      Aig_ObjCreateCo(p->pFrm,pAVar5);
      Aig_ManCleanup(p->pFrm);
      for (iVar6 = 1; iVar6 < p->vVisited->nSize; iVar6 = iVar6 + 2) {
        iVar4 = Vec_IntEntry(p->vVisited,iVar6 + -1);
        i = Vec_IntEntry(p->vVisited,iVar6);
        pAVar5 = Aig_ManObj(p->pAig,iVar4);
        Saig_BmcObjFrame(p,pAVar5,i);
      }
      iVar4 = p->iOutputLast + 1;
      p->iOutputLast = iVar4;
    }
    iVar6 = p->iFrameLast + 1;
    p->iFrameLast = iVar6;
    p->iOutputLast = 0;
  } while( true );
}

Assistant:

void Saig_BmcInterval( Saig_Bmc_t * p )
{
    Aig_Obj_t * pTarget;
    int i, iObj, iFrame;
    int nNodes = Aig_ManObjNum( p->pFrm );
    Vec_PtrClear( p->vTargets );
    p->iFramePrev = p->iFrameLast;
    for ( ; p->iFrameLast < p->nFramesMax; p->iFrameLast++, p->iOutputLast = 0 )
    { 
        if ( p->iOutputLast == 0 )
        {
            Saig_BmcObjSetFrame( p, Aig_ManConst1(p->pAig), p->iFrameLast, Aig_ManConst1(p->pFrm) );
        }
        for ( ; p->iOutputLast < Saig_ManPoNum(p->pAig); p->iOutputLast++ )
        {
            if ( Aig_ManObjNum(p->pFrm) >= nNodes + p->nNodesMax )
                return;
//            Saig_BmcIntervalExplore_rec( p, Aig_ManCo(p->pAig, p->iOutputLast), p->iFrameLast );
            Vec_IntClear( p->vVisited );
            pTarget = Saig_BmcIntervalConstruct_rec( p, Aig_ManCo(p->pAig, p->iOutputLast), p->iFrameLast, p->vVisited );
            Vec_PtrPush( p->vTargets, pTarget );
            Aig_ObjCreateCo( p->pFrm, pTarget );
            Aig_ManCleanup( p->pFrm ); // it is not efficient to cleanup the whole manager!!!
            // check if the node is gone
            Vec_IntForEachEntryDouble( p->vVisited, iObj, iFrame, i )
                Saig_BmcObjFrame( p, Aig_ManObj(p->pAig, iObj), iFrame );
            // it is not efficient to remove nodes, which may be used later!!!
        }
    }
}